

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

void arkInterpFree_Hermite(ARKodeMem_conflict ark_mem,ARKInterp interp)

{
  long lVar1;
  SUNContext_conflict pSVar2;
  ARKodeMem in_RSI;
  long in_RDI;
  N_Vector *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (ARKodeMem)0x0) {
    if (in_RSI->sunctx != (SUNContext_conflict)0x0) {
      if (*(long *)&in_RSI->sunctx->own_profiler != 0) {
        arkFreeVec(in_RSI,in_stack_ffffffffffffffe8);
        *(undefined8 *)&in_RSI->sunctx->own_profiler = 0;
      }
      if (in_RSI->sunctx->logger != (SUNLogger)0x0) {
        arkFreeVec(in_RSI,in_stack_ffffffffffffffe8);
        in_RSI->sunctx->logger = (SUNLogger)0x0;
      }
      lVar1._0_4_ = in_RSI->sunctx->own_logger;
      lVar1._4_4_ = in_RSI->sunctx->last_err;
      if (lVar1 != 0) {
        arkFreeVec(in_RSI,in_stack_ffffffffffffffe8);
        pSVar2 = in_RSI->sunctx;
        pSVar2->own_logger = 0;
        pSVar2->last_err = 0;
      }
      if (in_RSI->sunctx->err_handler != (SUNErrHandler_conflict)0x0) {
        arkFreeVec(in_RSI,in_stack_ffffffffffffffe8);
        in_RSI->sunctx->err_handler = (SUNErrHandler_conflict)0x0;
      }
      *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) + -2;
      *(long *)(in_RDI + 0x370) = *(long *)(in_RDI + 0x370) + -5;
      free(in_RSI->sunctx);
      in_RSI->sunctx = (SUNContext_conflict)0x0;
    }
    if (in_RSI->uround != 0.0) {
      free((void *)in_RSI->uround);
      in_RSI->uround = 0.0;
    }
    free(in_RSI);
  }
  return;
}

Assistant:

void arkInterpFree_Hermite(ARKodeMem ark_mem, ARKInterp interp)
{
  /* if interpolation structure is NULL, just return */
  if (interp == NULL) { return; }

  /* free content */
  if (interp->content != NULL)
  {
    if (HINT_FOLD(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FOLD(interp)));
      HINT_FOLD(interp) = NULL;
    }
    if (HINT_YOLD(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_YOLD(interp)));
      HINT_YOLD(interp) = NULL;
    }
    if (HINT_FA(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FA(interp)));
      HINT_FA(interp) = NULL;
    }
    if (HINT_FB(interp) != NULL)
    {
      arkFreeVec(ark_mem, &(HINT_FB(interp)));
      HINT_FB(interp) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= 2;
    ark_mem->liw -= 5;

    free(interp->content);
    interp->content = NULL;
  }

  /* free ops and interpolation structures */
  if (interp->ops)
  {
    free(interp->ops);
    interp->ops = NULL;
  }
  free(interp);
  interp = NULL;

  return;
}